

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_base64_decode(void)

{
  int iVar1;
  ptls_base64_decode_state_t state;
  ptls_buffer_t local_58;
  ptls_base64_decode_state_t local_38;
  
  local_58.base = "";
  local_58.capacity = 0;
  local_58.off = 0;
  local_58.is_allocated = 0;
  ptls_base64_decode_init(&local_38);
  iVar1 = ptls_base64_decode("aGVsbG8gd29ybGQ=",&local_38,&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x195);
  _ok((uint)(local_58.off == 0xb),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x196);
  _ok((uint)(*(long *)((long)local_58.base + 3) == 0x646c726f77206f6c &&
            *(long *)local_58.base == 0x6f77206f6c6c6568),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x197);
  local_58.off = 0;
  ptls_base64_decode_init(&local_38);
  iVar1 = ptls_base64_decode("a$b",&local_38,&local_58);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x19d);
  local_58.off = 0;
  ptls_base64_decode_init(&local_38);
  iVar1 = ptls_base64_decode(anon_var_dwarf_15ced,&local_38,&local_58);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1a5);
  (*ptls_clear_memory)(local_58.base,local_58.off);
  if (local_58.is_allocated != 0) {
    free(local_58.base);
  }
  return;
}

Assistant:

static void test_base64_decode(void)
{
    ptls_base64_decode_state_t state;
    ptls_buffer_t buf;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("aGVsbG8gd29ybGQ=", &state, &buf);
    ok(ret == 0);
    ok(buf.off == 11);
    ok(memcmp(buf.base, "hello world", 11) == 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a$b", &state, &buf);
    ok(ret != 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a\xFF"
                             "b",
                             &state, &buf);
    ok(ret != 0);

    ptls_buffer_dispose(&buf);
}